

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O1

protobuf_test_messages_proto3_TestAllTypesProto3 *
upb_test_mutable_optional_msg_ext(upb_test_TestExtensions *msg,upb_Arena *arena)

{
  upb_Extension *puVar1;
  protobuf_test_messages_proto3_TestAllTypesProto3 *ppVar2;
  
  if ((upb_test_optional_msg_ext_ext.field_dont_copy_me__upb_internal_use_only.
       mode_dont_copy_me__upb_internal_use_only & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/upb/message/test.upb.h"
                  ,0xca4,
                  "const struct protobuf_test_messages_proto3_TestAllTypesProto3 *upb_test_optional_msg_ext(const struct upb_test_TestExtensions *)"
                 );
  }
  if (upb_test_optional_msg_ext_ext.field_dont_copy_me__upb_internal_use_only.
      mode_dont_copy_me__upb_internal_use_only < 0xc0) {
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_8Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/upb/message/test.upb.h"
                  ,0xca6,
                  "const struct protobuf_test_messages_proto3_TestAllTypesProto3 *upb_test_optional_msg_ext(const struct upb_test_TestExtensions *)"
                 );
  }
  puVar1 = _upb_Message_Getext_dont_copy_me__upb_internal_use_only
                     (&msg->base_dont_copy_me__upb_internal_use_only,&upb_test_optional_msg_ext_ext)
  ;
  if ((upb_test_optional_msg_ext_ext.field_dont_copy_me__upb_internal_use_only.
       mode_dont_copy_me__upb_internal_use_only & 8) == 0) {
    __assert_fail("upb_MiniTableField_IsExtension(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x11d,
                  "void _upb_Message_GetExtensionField(const struct upb_Message *, const upb_MiniTableExtension *, const void *, void *)"
                 );
  }
  if (puVar1 == (upb_Extension *)0x0) {
    ppVar2 = (protobuf_test_messages_proto3_TestAllTypesProto3 *)
             arena->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)ppVar2) < 0x430) {
      ppVar2 = (protobuf_test_messages_proto3_TestAllTypesProto3 *)
               _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,0x430);
    }
    else {
      if ((protobuf_test_messages_proto3_TestAllTypesProto3 *)
          ((ulong)((long)&(ppVar2->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
          0xfffffffffffffff8) != ppVar2) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      arena->ptr_dont_copy_me__upb_internal_use_only = (char *)(ppVar2 + 0x86);
    }
    if (ppVar2 == (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0) {
      ppVar2 = (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0;
    }
    else {
      memset(ppVar2,0,0x430);
    }
    if (ppVar2 == (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0) {
      ppVar2 = (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0;
    }
    else {
      upb_test_set_optional_msg_ext(msg,ppVar2,arena);
    }
    return ppVar2;
  }
  ppVar2 = (protobuf_test_messages_proto3_TestAllTypesProto3 *)
           (*(code *)(&DAT_003a55f0 +
                     *(int *)(&DAT_003a55f0 +
                             (ulong)(upb_test_optional_msg_ext_ext.
                                     field_dont_copy_me__upb_internal_use_only.
                                     mode_dont_copy_me__upb_internal_use_only >> 6) * 4)))();
  return ppVar2;
}

Assistant:

UPB_INLINE struct protobuf_test_messages_proto3_TestAllTypesProto3* upb_test_mutable_optional_msg_ext(struct upb_test_TestExtensions* msg,
                                    upb_Arena* arena) {
  struct protobuf_test_messages_proto3_TestAllTypesProto3* sub = (struct protobuf_test_messages_proto3_TestAllTypesProto3*)upb_test_optional_msg_ext(msg);
  if (sub == NULL) {
    sub = (struct protobuf_test_messages_proto3_TestAllTypesProto3*)_upb_Message_New(&protobuf_0test_0messages__proto3__TestAllTypesProto3_msg_init, arena);
    if (sub) upb_test_set_optional_msg_ext(msg, sub, arena);
  }
  return sub;
}